

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O0

CCountryFlag * __thiscall CCountryFlags::GetByIndex(CCountryFlags *this,int Index,bool SkipBlocked)

{
  int iVar1;
  CCountryFlag *pCVar2;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  bool bVar3;
  int i;
  int local_1c;
  int local_14;
  
  local_14 = in_ESI;
  if ((in_DL & 1) != 0) {
    for (local_1c = 0;
        iVar1 = array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                ::size((array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                        *)(in_RDI + 0x10)), local_1c < iVar1; local_1c = local_1c + 1) {
      pCVar2 = array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::
               operator[]((array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                           *)(in_RDI + 0x10),local_1c);
      if (((pCVar2->m_Blocked & 1U) == 0) &&
         (bVar3 = local_14 == 0, local_14 = local_14 + -1, bVar3)) {
        pCVar2 = array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                 ::operator[]((array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                               *)(in_RDI + 0x10),local_1c);
        return pCVar2;
      }
    }
  }
  iVar1 = array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::size
                    ((array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                      *)(in_RDI + 0x10));
  iVar1 = maximum<int>(0,local_14 % iVar1);
  pCVar2 = array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>::
           operator[]((array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                       *)(in_RDI + 0x10),iVar1);
  return pCVar2;
}

Assistant:

const CCountryFlags::CCountryFlag *CCountryFlags::GetByIndex(int Index, bool SkipBlocked) const
{
	if(SkipBlocked)
	{
		for(int i = 0; i < m_aCountryFlags.size(); i++)
			if(!m_aCountryFlags[i].m_Blocked)
				if(!Index--)
					return &m_aCountryFlags[i];
	}
	return &m_aCountryFlags[maximum(0, Index%m_aCountryFlags.size())];
}